

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_memory_barrier2
          (Impl *this,Value *state,VkMemoryBarrier2KHR **out_info)

{
  VkMemoryBarrier2KHR *pVVar1;
  Type pGVar2;
  
  pVVar1 = (VkMemoryBarrier2KHR *)ScratchAllocator::allocate_raw(&this->allocator,0x30,0x10);
  if (pVVar1 != (VkMemoryBarrier2KHR *)0x0) {
    pVVar1->dstStageMask = 0;
    pVVar1->dstAccessMask = 0;
    pVVar1->srcStageMask = 0;
    pVVar1->srcAccessMask = 0;
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
  }
  *out_info = pVVar1;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"srcStageMask");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x100000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->srcStageMask = (VkPipelineStageFlags2)(pGVar2->data_).n;
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"srcAccessMask");
    if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x100000000000000) !=
        (undefined1  [16])0x0) {
      pVVar1->srcAccessMask = (VkAccessFlags2)(pGVar2->data_).n;
      pGVar2 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"dstStageMask");
      if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x100000000000000)
          != (undefined1  [16])0x0) {
        pVVar1->dstStageMask = (VkPipelineStageFlags2)(pGVar2->data_).n;
        pGVar2 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)state,"dstAccessMask");
        if ((undefined1  [16])
            ((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x100000000000000) !=
            (undefined1  [16])0x0) {
          pVVar1->dstAccessMask = (VkAccessFlags2)(pGVar2->data_).n;
          return true;
        }
      }
    }
  }
  __assert_fail("data_.f.flags & kUint64Flag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x71b,
                "uint64_t rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint64() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_memory_barrier2(const Value &state,
                                                VkMemoryBarrier2KHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkMemoryBarrier2KHR>();
	*out_info = info;

	info->srcStageMask = static_cast<VkPipelineStageFlags2KHR>(state["srcStageMask"].GetUint64());
	info->srcAccessMask = static_cast<VkAccessFlags2KHR>(state["srcAccessMask"].GetUint64());
	info->dstStageMask = static_cast<VkPipelineStageFlags2KHR>(state["dstStageMask"].GetUint64());
	info->dstAccessMask = static_cast<VkAccessFlags2KHR>(state["dstAccessMask"].GetUint64());

	return true;
}